

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

ssize_t __thiscall LayoutFile::write(LayoutFile *this,int __fd,void *__buf,size_t __n)

{
  Widget *pWVar1;
  ssize_t in_RAX;
  undefined4 in_register_00000034;
  string xml;
  
  pWVar1 = this->root;
  if (pWVar1 != (Widget *)0x0) {
    (**pWVar1->_vptr_Widget)(&xml,pWVar1,0);
    fwrite(xml._M_dataplus._M_p,1,(ulong)(uint)xml._M_string_length,
           (FILE *)CONCAT44(in_register_00000034,__fd));
    fflush((FILE *)CONCAT44(in_register_00000034,__fd));
    in_RAX = std::__cxx11::string::~string((string *)&xml);
  }
  return in_RAX;
}

Assistant:

void LayoutFile::write(FILE *f)
{
	if (root == nullptr)
		return;
	std::string xml = root->writeXml(0);
	unsigned int len = xml.length();
	fwrite(xml.c_str(), sizeof(char), len, f);
	fflush(f);
}